

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O3

void __thiscall
optimization::graph_color::Conflict_Map::delete_edge(Conflict_Map *this,VarId *var1,VarId *var2)

{
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *pmVar1;
  map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var2;
  size_t sVar3;
  size_t sVar4;
  VarId *pVVar5;
  VarId *__k;
  size_type sVar6;
  mapped_type *pmVar7;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *p_Var8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
  *p_Var11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  _Rb_tree_color _Var14;
  _Rb_tree_color _Var15;
  bool bVar16;
  pair<std::_Rb_tree_iterator<mir::inst::VarId>,_std::_Rb_tree_iterator<mir::inst::VarId>_> pVar17;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  pVar18;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_98;
  Conflict_Map *local_68;
  VarId *local_60;
  _Rb_tree_color local_54;
  size_t local_50;
  VarId *local_48;
  _Base_ptr local_40;
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *local_38;
  
  pmVar1 = &this->dynamic_Map;
  local_60 = var1;
  sVar6 = std::
          map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::count(pmVar1,var1);
  if ((sVar6 == 0) ||
     (sVar6 = std::
              map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
              ::count(pmVar1,var2), pVVar5 = local_60, sVar6 == 0)) {
    __assert_fail("dynamic_Map.count(var1) && dynamic_Map.count(var2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                  ,0xaa,
                  "void optimization::graph_color::Conflict_Map::delete_edge(mir::inst::VarId, mir::inst::VarId)"
                 );
  }
  pmVar7 = std::
           map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
           ::operator[](pmVar1,local_60);
  sVar3 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_38 = pmVar1;
  pmVar7 = std::
           map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
           ::operator[](pmVar1,var2);
  sVar4 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  this_00 = &this->edge_vars;
  _Var14 = (_Rb_tree_color)sVar3;
  local_68 = this;
  local_98._M_impl._0_4_ = _Var14;
  p_Var8 = &std::
            map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::operator[](this_00,(key_type_conflict *)&local_98)->_M_t;
  pVar17 = std::
           _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
           ::equal_range(p_Var8,pVVar5);
  std::
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::_M_erase_aux(p_Var8,(_Base_ptr)pVar17.first._M_node,(_Base_ptr)pVar17.second._M_node);
  _Var15 = (_Rb_tree_color)sVar4;
  local_98._M_impl._0_4_ = _Var15;
  p_Var8 = &std::
            map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::operator[](this_00,(key_type_conflict *)&local_98)->_M_t;
  local_48 = var2;
  pVar17 = std::
           _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
           ::equal_range(p_Var8,var2);
  std::
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::_M_erase_aux(p_Var8,(_Base_ptr)pVar17.first._M_node,(_Base_ptr)pVar17.second._M_node);
  local_50 = sVar3;
  local_98._M_impl._0_4_ = _Var14;
  pmVar9 = std::
           map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
           ::operator[](this_00,(key_type_conflict *)&local_98);
  if ((pmVar9->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    local_98._M_impl._0_4_ = SUB84(local_50,0);
    pVar18 = std::
             _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::equal_range(&this_00->_M_t,(key_type_conflict *)&local_98);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar18.first._M_node,(_Base_ptr)pVar18.second._M_node);
  }
  p_Var10 = (local_68->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_40 = &(local_68->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var12 = local_40;
  if (p_Var10 != (_Base_ptr)0x0) {
    do {
      bVar16 = p_Var10[1]._M_color < _Var15;
      if (!bVar16) {
        p_Var12 = p_Var10;
      }
      p_Var10 = (&p_Var10->_M_left)[bVar16];
    } while (p_Var10 != (_Base_ptr)0x0);
    if (((p_Var12 != local_40) && (p_Var12[1]._M_color <= _Var15)) &&
       (local_98._M_impl._0_4_ = _Var15,
       pmVar9 = std::
                map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                ::operator[](this_00,(key_type_conflict *)&local_98),
       (pmVar9->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)) {
      local_98._M_impl._0_4_ = _Var15;
      pVar18 = std::
               _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
               ::equal_range(&this_00->_M_t,(key_type_conflict *)&local_98);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar18.first._M_node,(_Base_ptr)pVar18.second._M_node
                    );
    }
  }
  pmVar1 = local_38;
  pVVar5 = local_60;
  p_Var8 = &std::
            map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::operator[](local_38,local_60)->_M_t;
  __k = local_48;
  pVar17 = std::
           _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
           ::equal_range(p_Var8,local_48);
  std::
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::_M_erase_aux(p_Var8,(_Base_ptr)pVar17.first._M_node,(_Base_ptr)pVar17.second._M_node);
  p_Var8 = &std::
            map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::operator[](pmVar1,__k)->_M_t;
  pVar17 = std::
           _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
           ::equal_range(p_Var8,pVVar5);
  std::
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::_M_erase_aux(p_Var8,(_Base_ptr)pVar17.first._M_node,(_Base_ptr)pVar17.second._M_node);
  p_Var10 = local_40;
  if (local_50 != 0) {
    _Var14 = (int)local_50 - _S_black;
    p_Var12 = (local_68->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var13 = local_40;
    if (p_Var12 == (_Base_ptr)0x0) {
LAB_00140d1e:
      p_Var2 = &local_98._M_impl.super__Rb_tree_header;
      local_98._M_impl._0_4_ = 0;
      local_98._M_impl._4_4_ = 0;
      local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_98._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_98._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      local_54 = _Var14;
      p_Var8 = &std::
                map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                ::operator[](this_00,&local_54)->_M_t;
      std::
      _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
      ::clear(p_Var8);
      if (local_98._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        (p_Var8->_M_impl).super__Rb_tree_header._M_header._M_color =
             local_98._M_impl.super__Rb_tree_header._M_header._M_color;
        (p_Var8->_M_impl).super__Rb_tree_header._M_header._M_parent =
             local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
        (p_Var8->_M_impl).super__Rb_tree_header._M_header._M_left =
             local_98._M_impl.super__Rb_tree_header._M_header._M_left;
        (p_Var8->_M_impl).super__Rb_tree_header._M_header._M_right =
             local_98._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_98._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
             &(p_Var8->_M_impl).super__Rb_tree_header._M_header;
        (p_Var8->_M_impl).super__Rb_tree_header._M_node_count =
             local_98._M_impl.super__Rb_tree_header._M_node_count;
        local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
        local_98._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      }
      std::
      _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
      ::~_Rb_tree(&local_98);
    }
    else {
      do {
        bVar16 = p_Var12[1]._M_color < _Var14;
        if (!bVar16) {
          p_Var13 = p_Var12;
        }
        p_Var12 = (&p_Var12->_M_left)[bVar16];
      } while (p_Var12 != (_Base_ptr)0x0);
      if ((p_Var13 == local_40) || (_Var14 < p_Var13[1]._M_color)) goto LAB_00140d1e;
    }
    local_98._M_impl._0_4_ = _Var14;
    p_Var11 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
               *)std::
                 map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                 ::operator[](this_00,(key_type_conflict *)&local_98);
    std::
    _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
    ::_M_insert_unique<mir::inst::VarId_const&>(p_Var11,local_60);
  }
  if (sVar4 == 0) {
    return;
  }
  _Var15 = _Var15 - _S_black;
  p_Var12 = (local_68->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var13 = p_Var10;
  if (p_Var12 != (_Base_ptr)0x0) {
    do {
      bVar16 = p_Var12[1]._M_color < _Var15;
      if (!bVar16) {
        p_Var13 = p_Var12;
      }
      p_Var12 = (&p_Var12->_M_left)[bVar16];
    } while (p_Var12 != (_Base_ptr)0x0);
    if ((p_Var13 != p_Var10) && (p_Var13[1]._M_color <= _Var15)) goto LAB_00140e93;
  }
  p_Var2 = &local_98._M_impl.super__Rb_tree_header;
  local_98._M_impl._0_4_ = 0;
  local_98._M_impl._4_4_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  local_54 = _Var15;
  p_Var8 = &std::
            map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::operator[](this_00,&local_54)->_M_t;
  std::
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::clear(p_Var8);
  if (local_98._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (p_Var8->_M_impl).super__Rb_tree_header._M_header._M_color =
         local_98._M_impl.super__Rb_tree_header._M_header._M_color;
    (p_Var8->_M_impl).super__Rb_tree_header._M_header._M_parent =
         local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
    (p_Var8->_M_impl).super__Rb_tree_header._M_header._M_left =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    (p_Var8->_M_impl).super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_98._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(p_Var8->_M_impl).super__Rb_tree_header._M_header;
    (p_Var8->_M_impl).super__Rb_tree_header._M_node_count =
         local_98._M_impl.super__Rb_tree_header._M_node_count;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  ::~_Rb_tree(&local_98);
LAB_00140e93:
  local_98._M_impl._0_4_ = _Var15;
  p_Var11 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
             *)std::
               map<unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
               ::operator[](this_00,(key_type_conflict *)&local_98);
  std::
  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
  ::_M_insert_unique<mir::inst::VarId_const&>(p_Var11,local_48);
  return;
}

Assistant:

void delete_edge(mir::inst::VarId var1, mir::inst::VarId var2) {
    assert(dynamic_Map.count(var1) && dynamic_Map.count(var2));
    auto size1 = dynamic_Map[var1].size();
    auto size2 = dynamic_Map[var2].size();
    edge_vars[size1].erase(var1);
    edge_vars[size2].erase(var2);
    if (!edge_vars[size1].size()) {
      edge_vars.erase(size1);
    }
    if (edge_vars.count(size2) && !edge_vars[size2].size()) {
      edge_vars.erase(size2);
    }
    dynamic_Map[var1].erase(var2);
    dynamic_Map[var2].erase(var1);
    if (size1 >= 1) {
      if (!edge_vars.count(size1 - 1)) {
        edge_vars[size1 - 1] = std::set<mir::inst::VarId>();
      }
      edge_vars[size1 - 1].insert(var1);
    }
    if (size2 >= 1) {
      if (!edge_vars.count(size2 - 1)) {
        edge_vars[size2 - 1] = std::set<mir::inst::VarId>();
      }
      edge_vars[size2 - 1].insert(var2);
    }
  }